

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O0

void af_cjk_metrics_init_blues(AF_CJKMetrics metrics,FT_Face face)

{
  bool bVar1;
  FT_Error FVar2;
  int iVar3;
  long lVar4;
  FT_Bool under_ref;
  FT_Pos shoot;
  FT_Pos ref;
  FT_Int pp;
  FT_Int last;
  FT_Int first;
  FT_Int nn;
  uint num_idx;
  FT_Vector *points;
  long lStack_3f0;
  FT_Int best_point;
  FT_Pos best_pos;
  FT_ULong glyph_index;
  FT_Pos *blue_shoot;
  FT_Pos *blue_ref;
  char *p;
  void *shaper_buf;
  AF_Blue_StringRec *bs;
  AF_StyleClass pAStack_3b0;
  AF_Blue_Stringset bss;
  AF_StyleClass sc;
  FT_Outline outline;
  AF_CJKAxis axis;
  FT_Error error;
  AF_CJKBlue blue;
  uint local_360;
  uint uStack_35c;
  FT_Bool fill;
  FT_UInt num_flats;
  FT_UInt num_fills;
  FT_Pos flats [51];
  FT_Pos local_1b8;
  FT_Pos fills [51];
  FT_Face face_local;
  AF_CJKMetrics metrics_local;
  
  pAStack_3b0 = (metrics->root).style_class;
  bs._4_4_ = pAStack_3b0->blue_stringset;
  shaper_buf = af_blue_stringsets + bs._4_4_;
  p = (char *)af_shaper_buf_create(face);
  for (; *shaper_buf != 0x1429; shaper_buf = (void *)((long)shaper_buf + 8)) {
    blue_ref = (FT_Pos *)(af_blue_strings + *shaper_buf);
    if ((*(ushort *)((long)shaper_buf + 4) & 2) == 0) {
      outline._32_8_ = metrics->axis + 1;
    }
    else {
      outline._32_8_ = metrics->axis;
    }
    uStack_35c = 0;
    local_360 = 0;
    bVar1 = true;
    while ((char)*blue_ref != '\0') {
      for (; (char)*blue_ref == ' '; blue_ref = (FT_Pos *)((long)blue_ref + 1)) {
      }
      if ((char)*blue_ref == '|') {
        bVar1 = false;
        blue_ref = (FT_Pos *)((long)blue_ref + 1);
      }
      else {
        blue_ref = (FT_Pos *)af_shaper_get_cluster((char *)blue_ref,&metrics->root,p,(uint *)&first)
        ;
        if (((uint)first < 2) &&
           (best_pos = af_shaper_get_elem(&metrics->root,p,0,(FT_Long *)0x0,(FT_Long *)0x0),
           best_pos != 0)) {
          FVar2 = FT_Load_Glyph(face,(FT_UInt)best_pos,1);
          memcpy(&sc,&face->glyph->outline,0x28);
          if ((FVar2 == 0) && (2 < sc._2_2_)) {
            nn._0_2_ = outline.n_contours;
            nn._2_2_ = outline.n_points;
            num_idx = outline._4_4_;
            points._4_4_ = -1;
            lStack_3f0 = 0;
            pp = 0;
            for (last = 0; last < (short)sc; last = last + 1) {
              iVar3 = (int)*(short *)(outline.tags + (long)last * 2);
              if (pp < iVar3) {
                if ((*(ushort *)((long)shaper_buf + 4) & 2) == 0) {
                  if ((*(ushort *)((long)shaper_buf + 4) & 1) == 0) {
                    for (ref._4_4_ = pp; ref._4_4_ <= iVar3; ref._4_4_ = ref._4_4_ + 1) {
                      if ((points._4_4_ < 0) ||
                         (*(long *)(outline._0_8_ + (long)ref._4_4_ * 0x10 + 8) < lStack_3f0)) {
                        points._4_4_ = ref._4_4_;
                        lStack_3f0 = *(long *)(outline._0_8_ + (long)ref._4_4_ * 0x10 + 8);
                      }
                    }
                  }
                  else {
                    for (ref._4_4_ = pp; ref._4_4_ <= iVar3; ref._4_4_ = ref._4_4_ + 1) {
                      if ((points._4_4_ < 0) ||
                         (lStack_3f0 < *(long *)(outline._0_8_ + (long)ref._4_4_ * 0x10 + 8))) {
                        points._4_4_ = ref._4_4_;
                        lStack_3f0 = *(long *)(outline._0_8_ + (long)ref._4_4_ * 0x10 + 8);
                      }
                    }
                  }
                }
                else if ((*(ushort *)((long)shaper_buf + 4) & 1) == 0) {
                  for (ref._4_4_ = pp; ref._4_4_ <= iVar3; ref._4_4_ = ref._4_4_ + 1) {
                    if ((points._4_4_ < 0) ||
                       (*(long *)(outline._0_8_ + (long)ref._4_4_ * 0x10) < lStack_3f0)) {
                      points._4_4_ = ref._4_4_;
                      lStack_3f0 = *(long *)(outline._0_8_ + (long)ref._4_4_ * 0x10);
                    }
                  }
                }
                else {
                  for (ref._4_4_ = pp; ref._4_4_ <= iVar3; ref._4_4_ = ref._4_4_ + 1) {
                    if ((points._4_4_ < 0) ||
                       (lStack_3f0 < *(long *)(outline._0_8_ + (long)ref._4_4_ * 0x10))) {
                      points._4_4_ = ref._4_4_;
                      lStack_3f0 = *(long *)(outline._0_8_ + (long)ref._4_4_ * 0x10);
                    }
                  }
                }
              }
              pp = iVar3 + 1;
            }
            if (bVar1) {
              fills[(ulong)uStack_35c - 1] = lStack_3f0;
              uStack_35c = uStack_35c + 1;
            }
            else {
              *(long *)(&num_flats + (ulong)local_360 * 2) = lStack_3f0;
              local_360 = local_360 + 1;
            }
          }
        }
      }
    }
    if ((local_360 != 0) || (uStack_35c != 0)) {
      af_sort_pos(uStack_35c,&local_1b8);
      af_sort_pos(local_360,(FT_Pos *)&num_flats);
      blue_shoot = (FT_Pos *)
                   (outline._32_8_ + 0x1b0 + (ulong)*(uint *)(outline._32_8_ + 0x1ac) * 0x38);
      glyph_index = (FT_ULong)(blue_shoot + 3);
      *(int *)(outline._32_8_ + 0x1ac) = *(int *)(outline._32_8_ + 0x1ac) + 1;
      if (local_360 == 0) {
        lVar4 = fills[(ulong)(uStack_35c >> 1) - 1];
        *(long *)glyph_index = lVar4;
        *blue_shoot = lVar4;
      }
      else if (uStack_35c == 0) {
        lVar4 = *(long *)(&num_flats + (ulong)(local_360 >> 1) * 2);
        *(long *)glyph_index = lVar4;
        *blue_shoot = lVar4;
      }
      else {
        *blue_shoot = fills[(ulong)(uStack_35c >> 1) - 1];
        *(long *)glyph_index = *(long *)(&num_flats + (ulong)(local_360 >> 1) * 2);
      }
      if (*(long *)glyph_index != *blue_shoot) {
        if ((*(ushort *)((long)shaper_buf + 4) & 1) != (ushort)(*(long *)glyph_index < *blue_shoot))
        {
          lVar4 = (*(long *)glyph_index + *blue_shoot) / 2;
          *(long *)glyph_index = lVar4;
          *blue_shoot = lVar4;
        }
      }
      *(undefined4 *)(blue_shoot + 6) = 0;
      if ((*(ushort *)((long)shaper_buf + 4) & 1) != 0) {
        *(uint *)(blue_shoot + 6) = *(uint *)(blue_shoot + 6) | 2;
      }
    }
  }
  af_shaper_buf_destroy(face,p);
  return;
}

Assistant:

static void
  af_cjk_metrics_init_blues( AF_CJKMetrics  metrics,
                             FT_Face        face )
  {
    FT_Pos      fills[AF_BLUE_STRING_MAX_LEN];
    FT_Pos      flats[AF_BLUE_STRING_MAX_LEN];

    FT_UInt     num_fills;
    FT_UInt     num_flats;

    FT_Bool     fill;

    AF_CJKBlue  blue;
    FT_Error    error;
    AF_CJKAxis  axis;
    FT_Outline  outline;

    AF_StyleClass  sc = metrics->root.style_class;

    AF_Blue_Stringset         bss = sc->blue_stringset;
    const AF_Blue_StringRec*  bs  = &af_blue_stringsets[bss];

    void*  shaper_buf;


    /* we walk over the blue character strings as specified in the   */
    /* style's entry in the `af_blue_stringset' array, computing its */
    /* extremum points (depending on the string properties)          */

    FT_TRACE5(( "cjk blue zones computation\n"
                "==========================\n"
                "\n" ));

    shaper_buf = af_shaper_buf_create( face );

    for ( ; bs->string != AF_BLUE_STRING_MAX; bs++ )
    {
      const char*  p = &af_blue_strings[bs->string];
      FT_Pos*      blue_ref;
      FT_Pos*      blue_shoot;


      if ( AF_CJK_IS_HORIZ_BLUE( bs ) )
        axis = &metrics->axis[AF_DIMENSION_HORZ];
      else
        axis = &metrics->axis[AF_DIMENSION_VERT];

#ifdef FT_DEBUG_LEVEL_TRACE
      {
        FT_String*  cjk_blue_name[4] =
        {
          (FT_String*)"bottom",    /* --   , --  */
          (FT_String*)"top",       /* --   , TOP */
          (FT_String*)"left",      /* HORIZ, --  */
          (FT_String*)"right"      /* HORIZ, TOP */
        };


        FT_TRACE5(( "blue zone %d (%s):\n",
                    axis->blue_count,
                    cjk_blue_name[AF_CJK_IS_HORIZ_BLUE( bs ) |
                                  AF_CJK_IS_TOP_BLUE( bs )   ] ));
      }
#endif /* FT_DEBUG_LEVEL_TRACE */

      num_fills = 0;
      num_flats = 0;

      fill = 1;  /* start with characters that define fill values */
      FT_TRACE5(( "  [overshoot values]\n" ));

      while ( *p )
      {
        FT_ULong    glyph_index;
        FT_Pos      best_pos;       /* same as points.y or points.x, resp. */
        FT_Int      best_point;
        FT_Vector*  points;

        unsigned int  num_idx;

#ifdef FT_DEBUG_LEVEL_TRACE
        const char*  p_old;
        FT_ULong     ch;
#endif


        while ( *p == ' ' )
          p++;

#ifdef FT_DEBUG_LEVEL_TRACE
        p_old = p;
        GET_UTF8_CHAR( ch, p_old );
#endif

        /* switch to characters that define flat values */
        if ( *p == '|' )
        {
          fill = 0;
          FT_TRACE5(( "  [reference values]\n" ));
          p++;
          continue;
        }

        /* reject input that maps to more than a single glyph */
        p = af_shaper_get_cluster( p, &metrics->root, shaper_buf, &num_idx );
        if ( num_idx > 1 )
          continue;

        /* load the character in the face -- skip unknown or empty ones */
        glyph_index = af_shaper_get_elem( &metrics->root,
                                          shaper_buf,
                                          0,
                                          NULL,
                                          NULL );
        if ( glyph_index == 0 )
        {
          FT_TRACE5(( "  U+%04lX unavailable\n", ch ));
          continue;
        }

        error   = FT_Load_Glyph( face, glyph_index, FT_LOAD_NO_SCALE );
        outline = face->glyph->outline;
        if ( error || outline.n_points <= 2 )
        {
          FT_TRACE5(( "  U+%04lX contains no (usable) outlines\n", ch ));
          continue;
        }

        /* now compute min or max point indices and coordinates */
        points     = outline.points;
        best_point = -1;
        best_pos   = 0;  /* make compiler happy */

        {
          FT_Int  nn;
          FT_Int  first = 0;
          FT_Int  last  = -1;


          for ( nn = 0; nn < outline.n_contours; first = last + 1, nn++ )
          {
            FT_Int  pp;


            last = outline.contours[nn];

            /* Avoid single-point contours since they are never rasterized. */
            /* In some fonts, they correspond to mark attachment points     */
            /* which are way outside of the glyph's real outline.           */
            if ( last <= first )
              continue;

            if ( AF_CJK_IS_HORIZ_BLUE( bs ) )
            {
              if ( AF_CJK_IS_RIGHT_BLUE( bs ) )
              {
                for ( pp = first; pp <= last; pp++ )
                  if ( best_point < 0 || points[pp].x > best_pos )
                  {
                    best_point = pp;
                    best_pos   = points[pp].x;
                  }
              }
              else
              {
                for ( pp = first; pp <= last; pp++ )
                  if ( best_point < 0 || points[pp].x < best_pos )
                  {
                    best_point = pp;
                    best_pos   = points[pp].x;
                  }
              }
            }
            else
            {
              if ( AF_CJK_IS_TOP_BLUE( bs ) )
              {
                for ( pp = first; pp <= last; pp++ )
                  if ( best_point < 0 || points[pp].y > best_pos )
                  {
                    best_point = pp;
                    best_pos   = points[pp].y;
                  }
              }
              else
              {
                for ( pp = first; pp <= last; pp++ )
                  if ( best_point < 0 || points[pp].y < best_pos )
                  {
                    best_point = pp;
                    best_pos   = points[pp].y;
                  }
              }
            }
          }

          FT_TRACE5(( "  U+%04lX: best_pos = %5ld\n", ch, best_pos ));
        }

        if ( fill )
          fills[num_fills++] = best_pos;
        else
          flats[num_flats++] = best_pos;

      } /* end while loop */

      if ( num_flats == 0 && num_fills == 0 )
      {
        /*
         *  we couldn't find a single glyph to compute this blue zone,
         *  we will simply ignore it then
         */
        FT_TRACE5(( "  empty\n" ));
        continue;
      }

      /* we have computed the contents of the `fill' and `flats' tables,   */
      /* now determine the reference and overshoot position of the blue -- */
      /* we simply take the median value after a simple sort               */
      af_sort_pos( num_fills, fills );
      af_sort_pos( num_flats, flats );

      blue       = &axis->blues[axis->blue_count];
      blue_ref   = &blue->ref.org;
      blue_shoot = &blue->shoot.org;

      axis->blue_count++;

      if ( num_flats == 0 )
      {
        *blue_ref   =
        *blue_shoot = fills[num_fills / 2];
      }
      else if ( num_fills == 0 )
      {
        *blue_ref   =
        *blue_shoot = flats[num_flats / 2];
      }
      else
      {
        *blue_ref   = fills[num_fills / 2];
        *blue_shoot = flats[num_flats / 2];
      }

      /* make sure blue_ref >= blue_shoot for top/right or */
      /* vice versa for bottom/left                        */
      if ( *blue_shoot != *blue_ref )
      {
        FT_Pos   ref       = *blue_ref;
        FT_Pos   shoot     = *blue_shoot;
        FT_Bool  under_ref = FT_BOOL( shoot < ref );


        /* AF_CJK_IS_TOP_BLUE covers `right' and `top' */
        if ( AF_CJK_IS_TOP_BLUE( bs ) ^ under_ref )
        {
          *blue_ref   =
          *blue_shoot = ( shoot + ref ) / 2;

          FT_TRACE5(( "  [reference smaller than overshoot,"
                      " taking mean value]\n" ));
        }
      }

      blue->flags = 0;
      if ( AF_CJK_IS_TOP_BLUE( bs ) )
        blue->flags |= AF_CJK_BLUE_TOP;

      FT_TRACE5(( "    -> reference = %ld\n"
                  "       overshoot = %ld\n",
                  *blue_ref, *blue_shoot ));

    } /* end for loop */

    af_shaper_buf_destroy( face, shaper_buf );

    FT_TRACE5(( "\n" ));

    return;
  }